

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textrender.cpp
# Opt level: O0

void __thiscall CTextRender::TextRefreshGlyphs(CTextRender *this,CTextCursor *pCursor)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  long in_RSI;
  long in_RDI;
  int i;
  int NumTotalPages;
  int NumQuads;
  int local_1c;
  
  iVar1 = array<CScaledGlyph,_allocator_default<CScaledGlyph>_>::size
                    ((array<CScaledGlyph,_allocator_default<CScaledGlyph>_> *)(in_RSI + 0x30));
  if (0 < iVar1) {
    uVar2 = CGlyphMap::NumTotalPages(*(CGlyphMap **)(in_RDI + 0x38));
    if (uVar2 != *(uint *)(in_RSI + 8)) {
      for (local_1c = 0;
          iVar1 = array<CScaledGlyph,_allocator_default<CScaledGlyph>_>::size
                            ((array<CScaledGlyph,_allocator_default<CScaledGlyph>_> *)
                             (in_RSI + 0x30)), local_1c < iVar1; local_1c = local_1c + 1) {
        array<CScaledGlyph,_allocator_default<CScaledGlyph>_>::operator[]
                  ((array<CScaledGlyph,_allocator_default<CScaledGlyph>_> *)(in_RSI + 0x30),local_1c
                  );
        CGlyphMap::RenderGlyph((CGlyphMap *)pCursor,_NumTotalPages,i._3_1_);
      }
      iVar1 = CGlyphMap::NumTotalPages(*(CGlyphMap **)(in_RDI + 0x38));
      *(int *)(in_RSI + 8) = iVar1;
    }
    uVar3 = CGlyphMap::NumTotalPages(*(CGlyphMap **)(in_RDI + 0x38));
    if (uVar2 != uVar3) {
      dbg_msg("textrender","page %d mismatch after refresh, atlas might be too small.",(ulong)uVar2)
      ;
    }
  }
  return;
}

Assistant:

void CTextRender::TextRefreshGlyphs(CTextCursor *pCursor)
{
	int NumQuads = pCursor->m_Glyphs.size();
	if(NumQuads <= 0)
		return;

	int NumTotalPages = m_pGlyphMap->NumTotalPages();

	if(NumTotalPages != pCursor->m_PageCountWhenDrawn)
	{
		// pages were dropped, re-render glyphs
		for(int i = 0; i < pCursor->m_Glyphs.size(); ++i)
			m_pGlyphMap->RenderGlyph(pCursor->m_Glyphs[i].m_pGlyph, true);
		pCursor->m_PageCountWhenDrawn = m_pGlyphMap->NumTotalPages();
	}

	if(NumTotalPages != m_pGlyphMap->NumTotalPages())
	{
		dbg_msg("textrender", "page %d mismatch after refresh, atlas might be too small.", NumTotalPages);
	}
}